

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSamplePositionCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  RenderContext *pRVar1;
  ContextType local_1cc;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream buf;
  int numTargetSamples_local;
  InterpolateAtSamplePositionCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,
                  "${GLSL_VERSION_DECL}\n${GLSL_EXT_SAMPLE_VARIABLES}${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}sample in highp vec2 v_screenPosition;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n\n\thighp vec2 offset = gl_SamplePosition - vec2(0.5, 0.5);\n\thighp vec2 offsetValue = interpolateAtOffset(v_screenPosition, offset);\n\thighp vec2 refValue = v_screenPosition;\n\n\tbool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n\tif (valuesEqual)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
                 );
  std::__cxx11::ostringstream::str();
  pRVar1 = Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1cc.super_ApiType.m_bits = (ApiType)(*pRVar1->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSamplePositionCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SAMPLE_VARIABLES}"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
			"sample in highp vec2 v_screenPosition;\n"
			"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	const highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n" // 0.03125 = mediump epsilon when value = 32 (RENDER_SIZE)
			"\n"
			"	highp vec2 offset = gl_SamplePosition - vec2(0.5, 0.5);\n"
			"	highp vec2 offsetValue = interpolateAtOffset(v_screenPosition, offset);\n"
			"	highp vec2 refValue = v_screenPosition;\n"
			"\n"
			"	bool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n"
			"	if (valuesEqual)\n"
			"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}